

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDistanceCalculator.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
determineIfBoundaryNodes
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ImportedUgrid *ugrid)

{
  pointer piVar1;
  pointer piVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  allocator_type local_1d;
  value_type_conflict2 local_1c;
  
  local_1c = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             (long)(int)((ulong)((long)(ugrid->nodes).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                 (long)(ugrid->nodes).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start >> 3) / 3),&local_1c,
             &local_1d);
  piVar2 = (ugrid->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(ugrid->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
  if (2 < uVar3) {
    piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      lVar5 = 0;
      do {
        piVar1[piVar2[lVar5]] = 1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      uVar4 = uVar4 + 1;
      piVar2 = piVar2 + 3;
    } while (uVar4 != uVar3 / 3);
  }
  piVar2 = (ugrid->quads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(ugrid->quads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
  if (3 < uVar3) {
    piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      lVar5 = 0;
      do {
        piVar1[piVar2[lVar5]] = 1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      uVar4 = uVar4 + 1;
      piVar2 = piVar2 + 4;
    } while (uVar4 != uVar3 >> 2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> determineIfBoundaryNodes(const Parfait::ImportedUgrid& ugrid){
    int nnodes = ugrid.nodes.size()/3;
    std::vector<int> is_boundary(nnodes, 0);
    for(int t = 0; t < ugrid.triangles.size() /3; t++){
        for(int i = 0; i < 3; i++){
            int n = ugrid.triangles[3*t+i];
            is_boundary[n] = 1;
        }
    }
    for(int q = 0; q < ugrid.quads.size() /4; q++){
        for(int i = 0; i < 4; i++){
            int n = ugrid.quads[4*q+i];
            is_boundary[n] = 1;
        }
    }
    return is_boundary;
}